

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

uint mg_init_library(uint features)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sl;
  int local_30;
  int key_create;
  int failed;
  int mutexattr_init;
  size_t len;
  int i;
  uint features_inited;
  uint features_to_init;
  uint features_local;
  
  uVar1 = mg_check_feature(features & 0xff);
  if ((mg_init_library_called < 1) &&
     (iVar2 = pthread_mutex_init((pthread_mutex_t *)&global_lock_mutex,(pthread_mutexattr_t *)0x0),
     iVar2 != 0)) {
    return 0;
  }
  mg_global_lock();
  if (mg_init_library_called < 1) {
    key_create = 1;
    local_30 = 1;
    iVar2 = pthread_key_create(&sTlsKey,tls_dtor);
    if ((iVar2 == 0) &&
       (key_create = pthread_mutexattr_init((pthread_mutexattr_t *)&pthread_mutex_attr),
       key_create == 0)) {
      local_30 = pthread_mutexattr_settype((pthread_mutexattr_t *)&pthread_mutex_attr,1);
    }
    if (local_30 != 0) {
      if (key_create == 0) {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&pthread_mutex_attr);
      }
      if (iVar2 == 0) {
        pthread_key_delete(sTlsKey);
      }
      mg_global_unlock();
      pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
      return 0;
    }
    _failed = 1;
    len._4_4_ = 0;
    while (http_methods[len._4_4_].name != (char *)0x0) {
      sVar3 = strlen(http_methods[len._4_4_].name);
      _failed = sVar3 + _failed;
      if (0 < len._4_4_) {
        _failed = _failed + 2;
      }
      len._4_4_ = len._4_4_ + 1;
    }
    all_methods = (char *)mg_malloc(_failed);
    if (all_methods == (char *)0x0) {
      mg_global_unlock();
      pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
      return 0;
    }
    *all_methods = '\0';
    len._4_4_ = 0;
    while (http_methods[len._4_4_].name != (char *)0x0) {
      if (len._4_4_ < 1) {
        strcpy(all_methods,http_methods[len._4_4_].name);
      }
      else {
        strcat(all_methods,", ");
        strcat(all_methods,http_methods[len._4_4_].name);
      }
      len._4_4_ = len._4_4_ + 1;
    }
  }
  if (mg_init_library_called < 1) {
    mg_init_library_called = 1;
  }
  else {
    mg_init_library_called = mg_init_library_called + 1;
  }
  mg_global_unlock();
  return uVar1;
}

Assistant:

CIVETWEB_API unsigned
mg_init_library(unsigned features)
{
	unsigned features_to_init = mg_check_feature(features & 0xFFu);
	unsigned features_inited = features_to_init;

	if (mg_init_library_called <= 0) {
		/* Not initialized yet */
		if (0 != pthread_mutex_init(&global_lock_mutex, NULL)) {
			return 0;
		}
	}

	mg_global_lock();

	if (mg_init_library_called <= 0) {
		int i;
		size_t len;

#if defined(_WIN32)
		int file_mutex_init = 1;
		int wsa = 1;
#else
		int mutexattr_init = 1;
#endif
		int failed = 1;
		int key_create = pthread_key_create(&sTlsKey, tls_dtor);

		if (key_create == 0) {
#if defined(_WIN32)
			file_mutex_init =
			    pthread_mutex_init(&global_log_file_lock, &pthread_mutex_attr);
			if (file_mutex_init == 0) {
				/* Start WinSock */
				WSADATA data;
				failed = wsa = WSAStartup(MAKEWORD(2, 2), &data);
			}
#else
			mutexattr_init = pthread_mutexattr_init(&pthread_mutex_attr);
			if (mutexattr_init == 0) {
				failed = pthread_mutexattr_settype(&pthread_mutex_attr,
				                                   PTHREAD_MUTEX_RECURSIVE);
			}
#endif
		}

		if (failed) {
#if defined(_WIN32)
			if (wsa == 0) {
				(void)WSACleanup();
			}
			if (file_mutex_init == 0) {
				(void)pthread_mutex_destroy(&global_log_file_lock);
			}
#else
			if (mutexattr_init == 0) {
				(void)pthread_mutexattr_destroy(&pthread_mutex_attr);
			}
#endif
			if (key_create == 0) {
				(void)pthread_key_delete(sTlsKey);
			}
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}

		len = 1;
		for (i = 0; http_methods[i].name != NULL; i++) {
			size_t sl = strlen(http_methods[i].name);
			len += sl;
			if (i > 0) {
				len += 2;
			}
		}
		all_methods = (char *)mg_malloc(len);
		if (!all_methods) {
			/* Must never happen */
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}
		all_methods[0] = 0;
		for (i = 0; http_methods[i].name != NULL; i++) {
			if (i > 0) {
				strcat(all_methods, ", ");
				strcat(all_methods, http_methods[i].name);
			} else {
				strcpy(all_methods, http_methods[i].name);
			}
		}
	}

#if defined(USE_LUA)
	lua_init_optional_libraries();
#endif

#if (defined(OPENSSL_API_1_0) || defined(OPENSSL_API_1_1)                      \
     || defined(OPENSSL_API_3_0))                                              \
    && !defined(NO_SSL)

	if (features_to_init & MG_FEATURES_SSL) {
		if (!mg_openssl_initialized) {
			char ebuf[128];
			if (initialize_openssl(ebuf, sizeof(ebuf))) {
				mg_openssl_initialized = 1;
			} else {
				(void)ebuf;
				DEBUG_TRACE("Initializing SSL failed: %s", ebuf);
				features_inited &= ~((unsigned)(MG_FEATURES_SSL));
			}
		} else {
			/* ssl already initialized */
		}
	}

#endif

	if (mg_init_library_called <= 0) {
		mg_init_library_called = 1;
	} else {
		mg_init_library_called++;
	}
	mg_global_unlock();

	return features_inited;
}